

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# That.hpp
# Opt level: O1

void ut11::Assert::That<bool,ut11::detail::NotOperand<ut11::Operands::TrueOperand>>
               (size_t line,string *file,bool *expected,
               NotOperand<ut11::Operands::TrueOperand> *operand)

{
  pointer pcVar1;
  size_type __dnew;
  string local_88;
  string local_68;
  string local_48;
  
  if (*expected == true) {
    pcVar1 = (file->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + file->_M_string_length);
    local_68._M_dataplus._M_p = (pointer)0x16;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    local_88._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_88,(ulong)&local_68);
    local_88.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
    builtin_strncpy(local_88._M_dataplus._M_p,"Expected Not failed: \n",0x16);
    local_88._M_string_length = (size_type)local_68._M_dataplus._M_p;
    local_88._M_dataplus._M_p[(long)local_68._M_dataplus._M_p] = '\0';
    Operands::TrueOperand::GetErrorMessage<bool>(&local_68,(TrueOperand *)operand,expected);
    std::__cxx11::string::_M_append((char *)&local_88,(ulong)local_68._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    Fail(line,&local_48,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

inline void That(std::size_t line, std::string file, const Expected& expected, const Operand& operand)
		{
			if ( operand(expected) )
				return;
			Fail(line, file, operand.GetErrorMessage(expected));
		}